

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019e130 = 0x2d2d2d2d2d2d2d;
    uRam000000000019e137._0_1_ = '-';
    uRam000000000019e137._1_1_ = '-';
    uRam000000000019e137._2_1_ = '-';
    uRam000000000019e137._3_1_ = '-';
    uRam000000000019e137._4_1_ = '-';
    uRam000000000019e137._5_1_ = '-';
    uRam000000000019e137._6_1_ = '-';
    uRam000000000019e137._7_1_ = '-';
    DAT_0019e120 = '-';
    DAT_0019e120_1._0_1_ = '-';
    DAT_0019e120_1._1_1_ = '-';
    DAT_0019e120_1._2_1_ = '-';
    DAT_0019e120_1._3_1_ = '-';
    DAT_0019e120_1._4_1_ = '-';
    DAT_0019e120_1._5_1_ = '-';
    DAT_0019e120_1._6_1_ = '-';
    uRam000000000019e128 = 0x2d2d2d2d2d2d2d;
    DAT_0019e12f = 0x2d;
    DAT_0019e110 = '-';
    DAT_0019e110_1._0_1_ = '-';
    DAT_0019e110_1._1_1_ = '-';
    DAT_0019e110_1._2_1_ = '-';
    DAT_0019e110_1._3_1_ = '-';
    DAT_0019e110_1._4_1_ = '-';
    DAT_0019e110_1._5_1_ = '-';
    DAT_0019e110_1._6_1_ = '-';
    uRam000000000019e118._0_1_ = '-';
    uRam000000000019e118._1_1_ = '-';
    uRam000000000019e118._2_1_ = '-';
    uRam000000000019e118._3_1_ = '-';
    uRam000000000019e118._4_1_ = '-';
    uRam000000000019e118._5_1_ = '-';
    uRam000000000019e118._6_1_ = '-';
    uRam000000000019e118._7_1_ = '-';
    DAT_0019e100 = '-';
    DAT_0019e100_1._0_1_ = '-';
    DAT_0019e100_1._1_1_ = '-';
    DAT_0019e100_1._2_1_ = '-';
    DAT_0019e100_1._3_1_ = '-';
    DAT_0019e100_1._4_1_ = '-';
    DAT_0019e100_1._5_1_ = '-';
    DAT_0019e100_1._6_1_ = '-';
    uRam000000000019e108._0_1_ = '-';
    uRam000000000019e108._1_1_ = '-';
    uRam000000000019e108._2_1_ = '-';
    uRam000000000019e108._3_1_ = '-';
    uRam000000000019e108._4_1_ = '-';
    uRam000000000019e108._5_1_ = '-';
    uRam000000000019e108._6_1_ = '-';
    uRam000000000019e108._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019e0f8._0_1_ = '-';
    uRam000000000019e0f8._1_1_ = '-';
    uRam000000000019e0f8._2_1_ = '-';
    uRam000000000019e0f8._3_1_ = '-';
    uRam000000000019e0f8._4_1_ = '-';
    uRam000000000019e0f8._5_1_ = '-';
    uRam000000000019e0f8._6_1_ = '-';
    uRam000000000019e0f8._7_1_ = '-';
    DAT_0019e13f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}